

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# at_application.h
# Opt level: O0

void __thiscall Application::fromAdmin(Application *this,Message *message,SessionID *sessionID)

{
  bool bVar1;
  Header *this_00;
  Session *this_01;
  string *senderDefaultApplVerID;
  undefined1 local_f0 [8];
  DefaultApplVerID defaultApplVerID;
  undefined1 local_80 [8];
  MsgType msgType;
  SessionID *sessionID_local;
  Message *message_local;
  Application *this_local;
  
  msgType.super_StringField.super_FieldBase.m_metrics._8_8_ = sessionID;
  FIX::MsgType::MsgType((MsgType *)local_80);
  this_00 = FIX::Message::getHeader(message);
  FIX::FieldMap::getField((FieldMap *)this_00,(FieldBase *)local_80);
  bVar1 = FIX::operator==((StringField *)local_80,"A");
  if (bVar1) {
    FIX::DefaultApplVerID::DefaultApplVerID((DefaultApplVerID *)local_f0);
    bVar1 = FIX::FieldMap::isSetField((FieldMap *)message,(FieldBase *)local_f0);
    if (bVar1) {
      FIX::FieldMap::getField((FieldMap *)message,(FieldBase *)local_f0);
      this_01 = (Session *)
                FIX::Session::lookupSession
                          ((SessionID *)msgType.super_StringField.super_FieldBase.m_metrics._8_8_);
      senderDefaultApplVerID = FIX::StringField::operator_cast_to_string_((StringField *)local_f0);
      FIX::Session::setSenderDefaultApplVerID(this_01,senderDefaultApplVerID);
    }
    FIX::DefaultApplVerID::~DefaultApplVerID((DefaultApplVerID *)local_f0);
  }
  FIX::MsgType::~MsgType((MsgType *)local_80);
  return;
}

Assistant:

EXCEPT( FIX::FieldNotFound, FIX::IncorrectDataFormat, FIX::IncorrectTagValue, FIX::RejectLogon )
  {
    FIX::MsgType msgType;
    message.getHeader().getField( msgType );
    if(msgType == FIX::MsgType_Logon)
    {
      FIX::DefaultApplVerID defaultApplVerID;
      if(message.isSetField(defaultApplVerID))
      {
        message.getField(defaultApplVerID);
        FIX::Session::lookupSession(sessionID)->setSenderDefaultApplVerID(defaultApplVerID);
      }
    }
  }